

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.c
# Opt level: O3

void DrawLine(Bitmap *bitmap,Vector v1,Vector v2,RGBTRIPLE *color)

{
  Vector v1_00;
  Vector v;
  Vector v1_01;
  Vector v1_02;
  Vector v2_00;
  Vector v2_01;
  Vector v2_02;
  int iVar1;
  longdouble in_ST0;
  longdouble lVar2;
  undefined8 uVar3;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  Vector unit;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_78;
  Vector cur;
  uint16_t local_3c;
  uint16_t local_34;
  
  v1_00.z._8_8_ = v1.x._0_8_;
  v1_00._0_40_ = v2._8_40_;
  v2_00.z._8_8_ = in_stack_fffffffffffffee8;
  v2_00._0_40_ = v1._8_40_;
  uVar3 = v1.x._0_8_;
  VectorSubtraction(v1_00,v2_00);
  v.x._8_8_ = local_108;
  v.x._0_8_ = uStack_110;
  v.y._0_8_ = uStack_100;
  v.y._8_8_ = local_f8;
  v.z._0_8_ = uStack_f0;
  v.z._8_8_ = uVar3;
  VectorL2Normalization(v);
  v1_01.z._8_8_ = v2.x._0_8_;
  v1_01._0_40_ = v1._8_40_;
  v2_01.z._8_8_ = in_stack_fffffffffffffee8;
  v2_01._0_40_ = v2._8_40_;
  VectorEuclideanDistance(v1_01,v2_01);
  cur.y._8_8_ = v1.z._0_8_;
  cur.z._0_8_ = v1.z._8_8_;
  cur.x._8_8_ = v1.y._0_8_;
  cur.y._0_2_ = v1.y._8_2_;
  cur.y._2_6_ = v1.y._10_6_;
  uStack_78 = v1.x._0_8_;
  cur.x._0_2_ = v1.x._8_2_;
  cur.x._2_6_ = v1.x._10_6_;
  if ((longdouble)0 <= in_ST0) {
    iVar1 = 1;
    do {
      local_3c = (uint16_t)(int)ROUND((longdouble)CONCAT28(cur.x._0_2_,uStack_78));
      local_34 = (uint16_t)
                 (int)ROUND((longdouble)(bitmap->dibHeader).bcHeight -
                            (longdouble)CONCAT28(cur.y._0_2_,cur.x._8_8_));
      BitmapSetPixelColor(bitmap,local_3c,local_34,color);
      v1_02.x._2_6_ = cur.x._2_6_;
      v1_02.x._0_2_ = cur.x._0_2_;
      v1_02.y._2_6_ = cur.y._2_6_;
      v1_02.y._0_2_ = cur.y._0_2_;
      v1_02.x._8_8_ = cur.x._8_8_;
      v1_02.y._8_8_ = cur.y._8_8_;
      v1_02.z._0_8_ = cur.z._0_8_;
      v1_02.z._8_8_ = uStack_e8;
      v2_02.x._8_8_ = unit.x._8_8_;
      v2_02.x._0_8_ = unit.x._0_8_;
      v2_02.y._0_8_ = unit.y._0_8_;
      v2_02.y._8_8_ = unit.y._8_8_;
      v2_02.z._0_8_ = unit.z._0_8_;
      v2_02.z._8_8_ = in_stack_fffffffffffffee8;
      VectorAddition(v1_02,v2_02);
      uStack_78 = unit.z._8_8_;
      cur.x._8_8_ = local_a8;
      cur.y._8_8_ = local_98;
      cur.z._0_8_ = uStack_90;
      cur.y._0_2_ = (undefined2)uStack_a0;
      cur.y._2_6_ = (undefined6)((ulong)uStack_a0 >> 0x10);
      cur.x._0_2_ = (undefined2)uStack_b0;
      cur.x._2_6_ = (undefined6)((ulong)uStack_b0 >> 0x10);
      lVar2 = (longdouble)iVar1;
      iVar1 = iVar1 + 1;
    } while (lVar2 <= in_ST0);
  }
  return;
}

Assistant:

void DrawLine(Bitmap *bitmap, const Vector v1, const Vector v2, const RGBTRIPLE *color) {
  Vector unit = VectorL2Normalization(VectorSubtraction(v2, v1));
  Real length = VectorEuclideanDistance(v1, v2);
  Vector cur = v1;
  for (int i = 0; i <= length; ++i) {
    BitmapSetPixelColor(bitmap, cur.x, bitmap->dibHeader.bcHeight - cur.y, color);
    cur = VectorAddition(cur, unit);
  }
}